

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void obj_ReadFile(char *fileName,uint fileID)

{
  Symbol *pSVar1;
  FileStackNodes *pFVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  FileStackNodeType FVar7;
  uint uVar8;
  ExportLevel EVar9;
  SectionType SVar10;
  FILE *__stream;
  FileStackNode *pFVar11;
  char *pcVar12;
  uint32_t *puVar13;
  Symbol **ppSVar14;
  SymbolList *pSVar15;
  void *__ptr;
  Section *pSVar16;
  void *__ptr_00;
  uint8_t *__ptr_01;
  size_t sVar17;
  Patch *patch;
  Symbol **ppSVar18;
  Assertion *patch_00;
  ulong uVar19;
  int *piVar20;
  byte bVar21;
  FileStackNode *pFVar22;
  long lVar23;
  Symbol *pSVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  char *pcVar29;
  char *fmt;
  undefined8 uVar30;
  ulong uVar31;
  ulong uVar32;
  uint32_t uVar33;
  FILE *tmpFile;
  size_t sVar34;
  bool bVar35;
  int matchedElems;
  int local_80;
  int local_5c;
  Patch *local_58;
  ulong local_50;
  char local_48 [24];
  
  iVar3 = strcmp("-",fileName);
  if (iVar3 == 0) {
    __stream = fdopen(0,"rb");
  }
  else {
    __stream = fopen(fileName,"rb");
  }
  if (__stream == (FILE *)0x0) {
    pcVar12 = "Could not open file %s";
  }
  else {
    iVar3 = getc(__stream);
    ungetc(iVar3,__stream);
    pFVar2 = nodes;
    if (iVar3 == 0x52) {
      iVar3 = __isoc99_fscanf(__stream,"RGB9%n",&local_5c);
      if ((iVar3 == 1) && (local_5c != 4)) {
        errx("%s: Not a RGBDS object file",fileName);
      }
      if (beVerbose == true) {
        fprintf(_stderr,"Reading object file %s\n",fileName);
      }
      uVar4 = getc(__stream);
      if (uVar4 == 0xffffffff) {
        uVar4 = 0;
        bVar35 = false;
      }
      else {
        iVar3 = 8;
        do {
          bVar35 = 0x17 < iVar3 - 8U;
          if (bVar35) break;
          iVar5 = getc(__stream);
          uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
          if (iVar5 == -1) {
            uVar25 = 0;
          }
          uVar4 = uVar4 | uVar25;
          iVar3 = iVar3 + 8;
        } while (iVar5 != -1);
      }
      if (bVar35) {
        if (uVar4 != 9) {
          pcVar12 = get_package_version_string();
          pcVar29 = "";
          if (9 < uVar4) {
            pcVar29 = " or updating rgblink";
          }
          errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s (expected revision %d, got %d)"
               ,fileName,pcVar12,fileName,pcVar29,9,uVar4);
        }
        uVar4 = getc(__stream);
        sVar26 = (size_t)uVar4;
        if (uVar4 == 0xffffffff) {
          bVar35 = false;
          sVar26 = 0;
        }
        else {
          iVar3 = 8;
          do {
            bVar35 = 0x17 < iVar3 - 8U;
            if (bVar35) break;
            iVar5 = getc(__stream);
            uVar4 = iVar5 << ((byte)iVar3 & 0x1f);
            if (iVar5 == -1) {
              uVar4 = 0;
            }
            sVar26 = (size_t)((uint)sVar26 | uVar4);
            iVar3 = iVar3 + 8;
          } while (iVar5 != -1);
        }
        if (bVar35) {
          uVar25 = getc(__stream);
          uVar4 = 0;
          if (uVar25 == 0xffffffff) {
            bVar35 = false;
          }
          else {
            iVar3 = 8;
            uVar4 = uVar25;
            do {
              bVar35 = 0x17 < iVar3 - 8U;
              if (bVar35) break;
              iVar5 = getc(__stream);
              uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
              if (iVar5 == -1) {
                uVar25 = 0;
              }
              uVar4 = uVar4 | uVar25;
              iVar3 = iVar3 + 8;
            } while (iVar5 != -1);
          }
          if (bVar35) {
            local_50 = (ulong)uVar4;
            nbSectionsToAssign = nbSectionsToAssign + local_50;
            uVar6 = getc(__stream);
            uVar25 = 0;
            if (uVar6 == 0xffffffff) {
              bVar35 = false;
            }
            else {
              iVar3 = 8;
              uVar25 = uVar6;
              do {
                bVar35 = 0x17 < iVar3 - 8U;
                if (bVar35) break;
                iVar5 = getc(__stream);
                uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                if (iVar5 == -1) {
                  uVar6 = 0;
                }
                uVar25 = uVar25 | uVar6;
                iVar3 = iVar3 + 8;
              } while (iVar5 != -1);
            }
            pFVar2 = nodes;
            if (bVar35) {
              nodes[fileID].nbNodes = uVar25;
              pFVar11 = (FileStackNode *)calloc((ulong)uVar25,0x20);
              pFVar2[fileID].nodes = pFVar11;
              if (pFVar11 == (FileStackNode *)0x0) {
                pcVar12 = "Failed to get memory for %s\'s nodes";
              }
              else {
                if (beVerbose == true) {
                  obj_ReadFile();
                }
                uVar31 = (ulong)nodes[fileID].nbNodes;
                while (uVar31 != 0) {
                  pFVar11 = nodes[fileID].nodes;
                  uVar6 = getc(__stream);
                  uVar25 = uVar6;
                  if (uVar6 == 0xffffffff) {
                    uVar25 = 0;
                  }
                  uVar27 = (ulong)uVar25;
                  if (uVar6 == 0xffffffff) {
                    bVar35 = false;
                  }
                  else {
                    iVar3 = 8;
                    do {
                      bVar35 = 0x17 < iVar3 - 8U;
                      if (bVar35) break;
                      iVar5 = getc(__stream);
                      uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
                      bVar35 = false;
                      if (iVar5 == -1) {
                        uVar25 = 0;
                      }
                      uVar27 = (ulong)((uint)uVar27 | uVar25);
                      iVar3 = iVar3 + 8;
                    } while (iVar5 != -1);
                  }
                  uVar31 = uVar31 - 1;
                  if (!bVar35) {
                    iVar3 = feof(__stream);
                    if (iVar3 == 0) {
                      piVar20 = __errno_location();
                      pcVar12 = strerror(*piVar20);
                    }
                    else {
                      pcVar12 = "Unexpected end of file";
                    }
                    pcVar29 = "%s: Cannot read node #%u\'s parent ID: %s";
LAB_00105395:
                    errx(pcVar29,fileName,uVar31 & 0xffffffff,pcVar12);
                  }
                  uVar25 = 0;
                  pFVar22 = (FileStackNode *)0x0;
                  if ((int)uVar27 != -1) {
                    pFVar22 = pFVar11 + uVar27;
                  }
                  pFVar11[uVar31].parent = pFVar22;
                  uVar6 = getc(__stream);
                  uVar33 = uVar25;
                  if (uVar6 != 0xffffffff) {
                    iVar3 = 8;
                    uVar25 = uVar6;
                    do {
                      bVar35 = 0x17 < iVar3 - 8U;
                      uVar33 = (uint32_t)bVar35;
                      if (bVar35) break;
                      iVar5 = getc(__stream);
                      uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                      uVar33 = 0;
                      if (iVar5 == -1) {
                        uVar6 = 0;
                      }
                      uVar25 = uVar25 | uVar6;
                      iVar3 = iVar3 + 8;
                    } while (iVar5 != -1);
                  }
                  if ((char)uVar33 == '\0') {
                    iVar3 = feof(__stream);
                    if (iVar3 == 0) {
                      piVar20 = __errno_location();
                      pcVar12 = strerror(*piVar20);
                    }
                    else {
                      pcVar12 = "Unexpected end of file";
                    }
                    pcVar29 = "%s: Cannot read node #%u\'s line number: %s";
                    goto LAB_00105395;
                  }
                  pFVar11 = pFVar11 + uVar31;
                  pFVar11->lineNo = uVar25;
                  FVar7 = getc(__stream);
                  if (FVar7 == ~NODE_REPT) {
                    iVar3 = feof(__stream);
                    if (iVar3 == 0) {
                      piVar20 = __errno_location();
                      pcVar12 = strerror(*piVar20);
                    }
                    else {
                      pcVar12 = "Unexpected end of file";
                    }
                    pcVar29 = "%s: Cannot read node #%u\'s type: %s";
                    goto LAB_00105395;
                  }
                  pFVar11->type = FVar7;
                  if (FVar7 - NODE_FILE < 2) {
                    pcVar12 = readstr((FILE *)__stream);
                    if (pcVar12 == (char *)0x0) {
                      iVar3 = feof(__stream);
                      if (iVar3 == 0) {
                        piVar20 = __errno_location();
                        pcVar12 = strerror(*piVar20);
                      }
                      else {
                        pcVar12 = "Unexpected end of file";
                      }
                      pcVar29 = "%s: Cannot read node #%u\'s file name: %s";
                      goto LAB_00105395;
                    }
                    (pFVar11->field_3).name = pcVar12;
                  }
                  else if (FVar7 == NODE_REPT) {
                    uVar8 = getc(__stream);
                    uVar25 = 0;
                    uVar6 = uVar25;
                    if (uVar8 != 0xffffffff) {
                      iVar3 = 8;
                      uVar25 = uVar8;
                      do {
                        bVar35 = 0x17 < iVar3 - 8U;
                        uVar6 = (uint)bVar35;
                        if (bVar35) break;
                        iVar5 = getc(__stream);
                        uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                        if (iVar5 == -1) {
                          uVar6 = 0;
                        }
                        uVar25 = uVar25 | uVar6;
                        iVar3 = iVar3 + 8;
                        uVar6 = 0;
                      } while (iVar5 != -1);
                    }
                    if ((char)uVar6 == '\0') {
                      iVar3 = feof(__stream);
                      if (iVar3 == 0) {
                        piVar20 = __errno_location();
                        pcVar12 = strerror(*piVar20);
                      }
                      else {
                        pcVar12 = "Unexpected end of file";
                      }
                      pcVar29 = "%s: Cannot read node #%u\'s rept depth: %s";
                      goto LAB_00105395;
                    }
                    (pFVar11->field_3).field_1.reptDepth = uVar25;
                    puVar13 = (uint32_t *)malloc((ulong)uVar25 << 2);
                    (pFVar11->field_3).field_1.iters = puVar13;
                    if (puVar13 == (uint32_t *)0x0) {
                      piVar20 = __errno_location();
                      pcVar12 = strerror(*piVar20);
                      fatal((FileStackNode *)0x0,0,"%s: Failed to alloc node #%u\'s iters: %s",
                            fileName,uVar31,pcVar12);
                    }
                    if (uVar25 != 0) {
                      uVar27 = 0;
                      do {
                        uVar8 = getc(__stream);
                        uVar25 = 0;
                        uVar6 = uVar25;
                        if (uVar8 != 0xffffffff) {
                          iVar3 = 8;
                          uVar25 = uVar8;
                          do {
                            bVar35 = 0x17 < iVar3 - 8U;
                            uVar6 = (uint)bVar35;
                            if (bVar35) break;
                            iVar5 = getc(__stream);
                            uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                            if (iVar5 == -1) {
                              uVar6 = 0;
                            }
                            uVar25 = uVar25 | uVar6;
                            iVar3 = iVar3 + 8;
                            uVar6 = 0;
                          } while (iVar5 != -1);
                        }
                        if ((char)uVar6 == '\0') {
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar12 = strerror(*piVar20);
                          }
                          else {
                            pcVar12 = "Unexpected end of file";
                          }
                          errx("%s: Cannot read node #%u\'s iter #%u: %s",fileName,uVar31,
                               uVar27 & 0xffffffff,pcVar12);
                        }
                        (pFVar11->field_3).field_1.iters[uVar27] = uVar25;
                        uVar27 = uVar27 + 1;
                      } while (uVar27 < (pFVar11->field_3).field_1.reptDepth);
                    }
                    if (pFVar11->parent == (FileStackNode *)0x0) {
                      fatal((FileStackNode *)0x0,0,
                            "%s is not a valid object file: root node (#%u) may not be REPT",
                            fileName,uVar31 & 0xffffffff);
                    }
                  }
                }
                ppSVar14 = (Symbol **)malloc(sVar26 * 8 + 1);
                if (ppSVar14 == (Symbol **)0x0) {
                  pcVar12 = "Failed to get memory for %s\'s symbols";
                }
                else {
                  pSVar15 = (SymbolList *)malloc(0x18);
                  if (pSVar15 != (SymbolList *)0x0) {
                    pSVar15->symbolList = ppSVar14;
                    pSVar15->nbSymbols = sVar26;
                    pSVar15->next = symbolLists;
                    uVar31 = (ulong)(uVar4 + (uVar4 == 0));
                    symbolLists = pSVar15;
                    __ptr = calloc(uVar31,4);
                    if (beVerbose == true) {
                      fprintf(_stderr,"Reading %u symbols...\n",sVar26);
                    }
                    local_80 = (int)sVar26;
                    if (local_80 != 0) {
                      sVar34 = 0;
                      do {
                        pSVar16 = (Section *)malloc(0x38);
                        if (pSVar16 == (Section *)0x0) {
                          pcVar12 = "%s: Couldn\'t create new symbol";
                          goto LAB_001050aa;
                        }
                        pFVar11 = nodes[fileID].nodes;
                        pcVar12 = readstr((FILE *)__stream);
                        if (pcVar12 == (char *)0x0) {
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar12 = strerror(*piVar20);
                          }
                          else {
                            pcVar12 = "Unexpected end of file";
                          }
                          pcVar29 = "%s: Cannot read symbol name: %s";
                          goto LAB_001051dc;
                        }
                        pSVar16->name = pcVar12;
                        EVar9 = getc(__stream);
                        if (EVar9 == ~SYMTYPE_LOCAL) goto LAB_00104e6e;
                        *(ExportLevel *)&pSVar16->size = EVar9;
                        if (EVar9 == SYMTYPE_IMPORT) {
                          *(int32_t *)&pSVar16->alignOfs = -1;
                        }
                        else {
                          *(char **)&pSVar16->modifier = fileName;
                          uVar25 = getc(__stream);
                          uVar19 = 0;
                          uVar32 = (ulong)uVar25;
                          uVar27 = uVar19;
                          if (uVar25 != 0xffffffff) {
                            iVar3 = 8;
                            do {
                              bVar35 = 0x17 < iVar3 - 8U;
                              uVar19 = (ulong)bVar35;
                              uVar27 = uVar32;
                              if (bVar35) break;
                              iVar5 = getc(__stream);
                              uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
                              uVar19 = 0;
                              if (iVar5 == -1) {
                                uVar25 = 0;
                              }
                              uVar32 = (ulong)((uint)uVar32 | uVar25);
                              iVar3 = iVar3 + 8;
                              uVar27 = uVar32;
                            } while (iVar5 != -1);
                          }
                          if ((char)uVar19 == '\0') {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s node ID: %s";
                            goto LAB_00105378;
                          }
                          *(FileStackNode **)&pSVar16->isBankFixed = pFVar11 + uVar27;
                          uVar8 = getc(__stream);
                          uVar25 = 0;
                          uVar6 = uVar25;
                          if (uVar8 != 0xffffffff) {
                            iVar3 = 8;
                            uVar25 = uVar8;
                            do {
                              bVar35 = 0x17 < iVar3 - 8U;
                              uVar6 = (uint)bVar35;
                              if (bVar35) break;
                              iVar5 = getc(__stream);
                              uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                              if (iVar5 == -1) {
                                uVar6 = 0;
                              }
                              uVar25 = uVar25 | uVar6;
                              iVar3 = iVar3 + 8;
                              uVar6 = 0;
                            } while (iVar5 != -1);
                          }
                          if ((char)uVar6 == '\0') {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s line number: %s";
                            goto LAB_00105378;
                          }
                          pSVar16->isAlignFixed = (bool)(char)uVar25;
                          pSVar16->field_0x21 = (char)(uVar25 >> 8);
                          pSVar16->alignMask = (short)(uVar25 >> 0x10);
                          uVar8 = getc(__stream);
                          uVar25 = 0;
                          uVar6 = uVar25;
                          if (uVar8 != 0xffffffff) {
                            iVar3 = 8;
                            uVar25 = uVar8;
                            do {
                              bVar35 = 0x17 < iVar3 - 8U;
                              uVar6 = (uint)bVar35;
                              if (bVar35) break;
                              iVar5 = getc(__stream);
                              uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                              if (iVar5 == -1) {
                                uVar6 = 0;
                              }
                              uVar25 = uVar25 | uVar6;
                              iVar3 = iVar3 + 8;
                              uVar6 = 0;
                            } while (iVar5 != -1);
                          }
                          if ((char)uVar6 == '\0') {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s section ID: %s";
                            goto LAB_00105378;
                          }
                          *(uint *)&pSVar16->alignOfs = uVar25;
                          uVar8 = getc(__stream);
                          uVar25 = 0;
                          uVar6 = uVar25;
                          if (uVar8 != 0xffffffff) {
                            iVar3 = 8;
                            uVar25 = uVar8;
                            do {
                              bVar35 = 0x17 < iVar3 - 8U;
                              uVar6 = (uint)bVar35;
                              if (bVar35) break;
                              iVar5 = getc(__stream);
                              uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                              if (iVar5 == -1) {
                                uVar6 = 0;
                              }
                              uVar25 = uVar25 | uVar6;
                              iVar3 = iVar3 + 8;
                              uVar6 = 0;
                            } while (iVar5 != -1);
                          }
                          if ((char)uVar6 == '\0') {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s value: %s";
                            goto LAB_00105378;
                          }
                          ((anon_union_4_2_cfd5e4c1_for_Symbol_6 *)&pSVar16->data)->offset = uVar25;
                        }
                        ppSVar14[sVar34] = (Symbol *)pSVar16;
                        if (*(ExportLevel *)&pSVar16->size == SYMTYPE_EXPORT) {
                          sym_AddSymbol((Symbol *)pSVar16);
                        }
                        if ((long)*(int *)&pSVar16->alignOfs != -1) {
                          piVar20 = (int *)((long)__ptr + (long)*(int *)&pSVar16->alignOfs * 4);
                          *piVar20 = *piVar20 + 1;
                        }
                        sVar34 = sVar34 + 1;
                      } while (sVar34 != sVar26);
                    }
                    __ptr_00 = malloc(uVar31 << 3);
                    if (beVerbose != false) {
                      fprintf(_stderr,"Reading %u sections...\n",(ulong)uVar4);
                    }
                    if (uVar4 != 0) {
                      uVar31 = 0;
                      do {
                        pSVar16 = (Section *)malloc(0x60);
                        *(Section **)((long)__ptr_00 + uVar31 * 8) = pSVar16;
                        if (pSVar16 == (Section *)0x0) {
                          pcVar12 = "%s: Couldn\'t create new section";
                          goto LAB_001050aa;
                        }
                        pSVar16->nextu = (Section *)0x0;
                        pFVar11 = nodes[fileID].nodes;
                        pcVar12 = readstr((FILE *)__stream);
                        if (pcVar12 == (char *)0x0) {
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar12 = strerror(*piVar20);
                          }
                          else {
                            pcVar12 = "Unexpected end of file";
                          }
                          pcVar29 = "%s: Cannot read section name: %s";
                          goto LAB_001051dc;
                        }
                        pSVar16->name = pcVar12;
                        uVar8 = getc(__stream);
                        uVar25 = 0;
                        uVar6 = uVar25;
                        if (uVar8 != 0xffffffff) {
                          iVar3 = 8;
                          uVar25 = uVar8;
                          do {
                            bVar35 = 0x17 < iVar3 - 8U;
                            uVar6 = (uint)bVar35;
                            if (bVar35) break;
                            iVar5 = getc(__stream);
                            uVar8 = iVar5 << ((byte)iVar3 & 0x1f);
                            uVar6 = 0;
                            if (iVar5 == -1) {
                              uVar8 = 0;
                            }
                            uVar25 = uVar25 | uVar8;
                            iVar3 = iVar3 + 8;
                          } while (iVar5 != -1);
                        }
                        if ((char)uVar6 == '\0') {
                          pcVar12 = pSVar16->name;
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar29 = strerror(*piVar20);
                          }
                          else {
                            pcVar29 = "Unexpected end of file";
                          }
                          fmt = "%s: Cannot read \"%s\"\'s\' size: %s";
                          goto LAB_00105378;
                        }
                        if (0xffff < uVar25) {
                          errx("\"%s\"\'s section size (%d) is invalid",pSVar16->name);
                        }
                        pSVar16->size = (uint16_t)uVar25;
                        pSVar16->offset = 0;
                        SVar10 = getc(__stream);
                        if (SVar10 == ~SECTTYPE_WRAM0) goto LAB_00104e6e;
                        pSVar16->type = SVar10 & 0x3f;
                        if ((SVar10 & 0xff) < 0x80) {
                          if ((SVar10 & 0xff) < 0x40) {
                            pSVar16->modifier = SECTION_NORMAL;
                          }
                          else {
                            pSVar16->modifier = SECTION_FRAGMENT;
                          }
                        }
                        else {
                          pSVar16->modifier = SECTION_UNION;
                        }
                        uVar8 = getc(__stream);
                        uVar25 = 0;
                        uVar6 = uVar25;
                        if (uVar8 != 0xffffffff) {
                          iVar3 = 8;
                          do {
                            bVar35 = 0x17 < iVar3 - 8U;
                            uVar25 = uVar8;
                            uVar6 = (uint)bVar35;
                            if (bVar35) break;
                            iVar5 = getc(__stream);
                            uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
                            if (iVar5 == -1) {
                              uVar25 = 0;
                            }
                            uVar8 = uVar8 | uVar25;
                            iVar3 = iVar3 + 8;
                            uVar25 = uVar8;
                            uVar6 = 0;
                          } while (iVar5 != -1);
                        }
                        if ((char)uVar6 == '\0') {
                          pcVar12 = pSVar16->name;
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar29 = strerror(*piVar20);
                          }
                          else {
                            pcVar29 = "Unexpected end of file";
                          }
                          fmt = "%s: Cannot read \"%s\"\'s org: %s";
                          goto LAB_00105378;
                        }
                        pSVar16->isAddressFixed = -1 < (int)uVar25;
                        if (0xffff < (int)uVar25) {
                          error((FileStackNode *)0x0,0,"\"%s\"\'s org is too large (%d)");
                          uVar25 = 0xffff;
                        }
                        pSVar16->org = (uint16_t)uVar25;
                        uVar8 = getc(__stream);
                        uVar25 = 0;
                        uVar6 = uVar25;
                        if (uVar8 != 0xffffffff) {
                          iVar3 = 8;
                          uVar25 = uVar8;
                          do {
                            bVar35 = 0x17 < iVar3 - 8U;
                            uVar6 = (uint)bVar35;
                            if (bVar35) break;
                            iVar5 = getc(__stream);
                            uVar6 = iVar5 << ((byte)iVar3 & 0x1f);
                            if (iVar5 == -1) {
                              uVar6 = 0;
                            }
                            uVar25 = uVar25 | uVar6;
                            iVar3 = iVar3 + 8;
                            uVar6 = 0;
                          } while (iVar5 != -1);
                        }
                        if ((char)uVar6 == '\0') {
                          pcVar12 = pSVar16->name;
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar29 = strerror(*piVar20);
                          }
                          else {
                            pcVar29 = "Unexpected end of file";
                          }
                          fmt = "%s: Cannot read \"%s\"\'s bank: %s";
                          goto LAB_00105378;
                        }
                        pSVar16->isBankFixed = -1 < (int)uVar25;
                        pSVar16->bank = uVar25;
                        uVar25 = getc(__stream);
                        if (uVar25 == 0xffffffff) {
                          pcVar12 = pSVar16->name;
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar29 = strerror(*piVar20);
                          }
                          else {
                            pcVar29 = "Unexpected end of file";
                          }
                          fmt = "%s: Cannot read \"%s\"\'s alignment: %s";
                          goto LAB_00105378;
                        }
                        bVar21 = 0x10;
                        if ((uVar25 & 0xff) < 0x10) {
                          bVar21 = (byte)uVar25;
                        }
                        pSVar16->isAlignFixed = (uVar25 & 0xff) != 0;
                        pSVar16->alignMask = ~(ushort)(-1 << (bVar21 & 0x1f));
                        uVar8 = getc(__stream);
                        uVar25 = 0;
                        uVar6 = uVar25;
                        if (uVar8 != 0xffffffff) {
                          iVar3 = 8;
                          do {
                            bVar35 = 0x17 < iVar3 - 8U;
                            uVar25 = uVar8;
                            uVar6 = (uint)bVar35;
                            if (bVar35) break;
                            iVar5 = getc(__stream);
                            uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
                            if (iVar5 == -1) {
                              uVar25 = 0;
                            }
                            uVar8 = uVar8 | uVar25;
                            iVar3 = iVar3 + 8;
                            uVar25 = uVar8;
                            uVar6 = 0;
                          } while (iVar5 != -1);
                        }
                        if ((char)uVar6 == '\0') {
                          pcVar12 = pSVar16->name;
                          iVar3 = feof(__stream);
                          if (iVar3 == 0) {
                            piVar20 = __errno_location();
                            pcVar29 = strerror(*piVar20);
                          }
                          else {
                            pcVar29 = "Unexpected end of file";
                          }
                          fmt = "%s: Cannot read \"%s\"\'s alignment offset: %s";
                          goto LAB_00105378;
                        }
                        if (0xffff < (int)uVar25) {
                          error((FileStackNode *)0x0,0,
                                "\"%s\"\'s alignment offset is too large (%d)");
                          uVar25 = 0xffff;
                        }
                        pSVar16->alignOfs = (uint16_t)uVar25;
                        if (pSVar16->type == SECTTYPE_INVALID) goto LAB_00104e96;
                        if ((pSVar16->type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
                          uVar27 = (ulong)pSVar16->size;
                          __ptr_01 = (uint8_t *)malloc(uVar27 + 1);
                          if (__ptr_01 == (uint8_t *)0x0) {
                            pcVar12 = pSVar16->name;
                            pcVar29 = "%s: Unable to read \"%s\"\'s data";
LAB_00105287:
                            err(pcVar29,fileName,pcVar12);
                          }
                          if ((uVar27 != 0) &&
                             (sVar17 = fread(__ptr_01,1,uVar27,__stream), sVar17 != pSVar16->size))
                          {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s data: %s";
                            goto LAB_00105378;
                          }
                          pSVar16->data = __ptr_01;
                          uVar25 = getc(__stream);
                          uVar19 = 0;
                          uVar32 = (ulong)uVar25;
                          uVar27 = uVar19;
                          if (uVar25 != 0xffffffff) {
                            iVar3 = 8;
                            do {
                              bVar35 = 0x17 < iVar3 - 8U;
                              uVar19 = (ulong)bVar35;
                              uVar27 = uVar32;
                              if (bVar35) break;
                              iVar5 = getc(__stream);
                              uVar25 = iVar5 << ((byte)iVar3 & 0x1f);
                              uVar19 = 0;
                              if (iVar5 == -1) {
                                uVar25 = 0;
                              }
                              uVar32 = (ulong)((uint)uVar32 | uVar25);
                              iVar3 = iVar3 + 8;
                              uVar27 = uVar32;
                            } while (iVar5 != -1);
                          }
                          if ((char)uVar19 == '\0') {
                            pcVar12 = pSVar16->name;
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar29 = strerror(*piVar20);
                            }
                            else {
                              pcVar29 = "Unexpected end of file";
                            }
                            fmt = "%s: Cannot read \"%s\"\'s number of patches: %s";
                            goto LAB_00105378;
                          }
                          pSVar16->nbPatches = (uint32_t)uVar27;
                          patch = (Patch *)malloc(uVar27 * 0x30 + 1);
                          if (patch == (Patch *)0x0) {
                            pcVar12 = pSVar16->name;
                            pcVar29 = "%s: Unable to read \"%s\"\'s patches";
                            goto LAB_00105287;
                          }
                          lVar23 = 0x38;
                          if ((uint32_t)uVar27 != 0) {
                            uVar27 = 0;
                            local_58 = patch;
                            do {
                              readPatch((FILE *)__stream,patch,fileName,pSVar16->name,
                                        (uint32_t)uVar27,pFVar11);
                              uVar27 = uVar27 + 1;
                              patch = patch + 1;
                            } while (uVar27 < pSVar16->nbPatches);
                            lVar23 = 0x38;
                            patch = local_58;
                          }
                        }
                        else {
                          lVar23 = 0x28;
                          patch = (Patch *)0x0;
                        }
                        *(Patch **)((long)&pSVar16->name + lVar23) = patch;
                        pSVar16->fileSymbols = ppSVar14;
                        uVar27 = (ulong)*(uint *)((long)__ptr + uVar31 * 4);
                        if (uVar27 == 0) {
                          pSVar16->symbols = (Symbol **)0x0;
                        }
                        else {
                          ppSVar18 = (Symbol **)malloc(uVar27 << 3);
                          pSVar16->symbols = ppSVar18;
                          if (ppSVar18 == (Symbol **)0x0) {
                            pcVar12 = "%s: Couldn\'t link to symbols";
                            goto LAB_001050aa;
                          }
                        }
                        pSVar16->nbSymbols = 0;
                        sect_AddSection(pSVar16);
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != local_50);
                    }
                    free(__ptr);
                    if (uVar4 != 0) {
                      uVar25 = 0;
                      do {
                        lVar23 = *(long *)((long)__ptr_00 + (ulong)uVar25 * 8);
                        if (*(uint *)(lVar23 + 0xc) == 8) {
LAB_00104e96:
                          __assert_fail("type != SECTTYPE_INVALID",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                                        ,0x65,"bool sect_HasData(enum SectionType)");
                        }
                        if (((*(uint *)(lVar23 + 0xc) & 0xfffffffe) == 2) &&
                           (uVar6 = *(uint *)(lVar23 + 0x30), (ulong)uVar6 != 0)) {
                          lVar23 = *(long *)(lVar23 + 0x38);
                          lVar28 = 0;
                          do {
                            uVar31 = (ulong)*(uint *)(lVar23 + 0x10 + lVar28);
                            if (uVar31 == 0xffffffff) {
                              uVar30 = 0;
                            }
                            else {
                              uVar30 = *(undefined8 *)((long)__ptr_00 + uVar31 * 8);
                            }
                            *(undefined8 *)(lVar23 + 0x28 + lVar28) = uVar30;
                            lVar28 = lVar28 + 0x30;
                          } while ((ulong)uVar6 * 0x30 != lVar28);
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar4);
                    }
                    if (local_80 != 0) {
                      sVar34 = 0;
                      do {
                        pSVar24 = ppSVar14[sVar34];
                        if ((long)pSVar24->sectionID == -1) {
                          pSVar16 = (Section *)0x0;
                        }
                        else {
                          pSVar16 = *(Section **)((long)__ptr_00 + (long)pSVar24->sectionID * 8);
                          uVar4 = pSVar16->nbSymbols;
                          if (uVar4 == 0) {
                            uVar31 = 0;
                          }
                          else {
                            uVar31 = 0;
                            uVar25 = uVar4;
                            do {
                              uVar6 = (int)uVar31 + uVar25 >> 1;
                              if ((pSVar16->symbols[uVar6]->field_6).offset <=
                                  (pSVar24->field_6).offset) {
                                uVar31 = (ulong)(uVar6 + 1);
                                uVar6 = uVar25;
                              }
                              uVar25 = uVar6;
                            } while ((uint)uVar31 != uVar25);
                          }
                          for (; (uint)uVar31 <= uVar4; uVar31 = (ulong)((uint)uVar31 + 1)) {
                            pSVar1 = pSVar16->symbols[uVar31];
                            pSVar16->symbols[uVar31] = pSVar24;
                            pSVar24 = pSVar1;
                          }
                          pSVar16->nbSymbols = uVar4 + 1;
                          if (pSVar16->modifier != SECTION_NORMAL) {
                            if (pSVar16->modifier == SECTION_FRAGMENT) {
                              (ppSVar14[sVar34]->field_6).offset =
                                   (ppSVar14[sVar34]->field_6).offset + (uint)pSVar16->offset;
                            }
                            if (pSVar16->modifier != SECTION_NORMAL) {
                              pSVar16 = sect_GetSection(pSVar16->name);
                            }
                          }
                          pSVar24 = ppSVar14[sVar34];
                        }
                        pSVar24->section = pSVar16;
                        sVar34 = sVar34 + 1;
                      } while (sVar34 != sVar26);
                    }
                    uVar4 = getc(__stream);
                    uVar31 = (ulong)uVar4;
                    if (uVar4 == 0xffffffff) {
                      bVar35 = false;
                      uVar31 = 0;
                    }
                    else {
                      iVar3 = 8;
                      do {
                        bVar35 = 0x17 < iVar3 - 8U;
                        if (bVar35) break;
                        iVar5 = getc(__stream);
                        uVar4 = iVar5 << ((byte)iVar3 & 0x1f);
                        if (iVar5 == -1) {
                          uVar4 = 0;
                        }
                        uVar31 = (ulong)((uint)uVar31 | uVar4);
                        iVar3 = iVar3 + 8;
                      } while (iVar5 != -1);
                    }
                    if (bVar35) {
                      if (beVerbose == true) {
                        fprintf(_stderr,"Reading %u assertions...\n",uVar31);
                      }
                      if ((uint)uVar31 != 0) {
                        uVar27 = 0;
                        do {
                          patch_00 = (Assertion *)malloc(0x48);
                          if (patch_00 == (Assertion *)0x0) {
                            pcVar12 = "%s: Couldn\'t create new assertion";
                            goto LAB_001050aa;
                          }
                          pFVar11 = nodes[fileID].nodes;
                          snprintf(local_48,0x16,"Assertion #%u",uVar27);
                          readPatch((FILE *)__stream,(Patch *)patch_00,fileName,local_48,0,pFVar11);
                          pcVar12 = readstr((FILE *)__stream);
                          if (pcVar12 == (char *)0x0) {
                            iVar3 = feof(__stream);
                            if (iVar3 == 0) {
                              piVar20 = __errno_location();
                              pcVar12 = strerror(*piVar20);
                            }
                            else {
                              pcVar12 = "Unexpected end of file";
                            }
                            pcVar29 = "%s: Cannot read assertion\'s message: %s";
                            goto LAB_001051dc;
                          }
                          patch_00->message = pcVar12;
                          uVar19 = (ulong)(patch_00->patch).pcSectionID;
                          if (uVar19 == 0xffffffff) {
                            pSVar16 = (Section *)0x0;
                          }
                          else {
                            pSVar16 = *(Section **)((long)__ptr_00 + uVar19 * 8);
                          }
                          (patch_00->patch).pcSection = pSVar16;
                          patch_00->fileSymbols = ppSVar14;
                          patch_00->next = assertions;
                          uVar4 = (int)uVar27 + 1;
                          uVar27 = (ulong)uVar4;
                          assertions = patch_00;
                        } while ((uint)uVar31 != uVar4);
                      }
                      free(__ptr_00);
                      fclose(__stream);
                      return;
                    }
                    iVar3 = feof(__stream);
                    if (iVar3 == 0) {
                      piVar20 = __errno_location();
                      pcVar12 = strerror(*piVar20);
                    }
                    else {
                      pcVar12 = "Unexpected end of file";
                    }
                    pcVar29 = "%s: Cannot read number of assertions: %s";
                    goto LAB_001051dc;
                  }
                  pcVar12 = "Failed to register %s\'s symbol list";
                }
              }
              goto LAB_001050aa;
            }
            iVar3 = feof(__stream);
            if (iVar3 == 0) {
              piVar20 = __errno_location();
              pcVar12 = strerror(*piVar20);
            }
            else {
              pcVar12 = "Unexpected end of file";
            }
            pcVar29 = "%s: Cannot read number of nodes: %s";
          }
          else {
            iVar3 = feof(__stream);
            if (iVar3 == 0) {
              piVar20 = __errno_location();
              pcVar12 = strerror(*piVar20);
            }
            else {
              pcVar12 = "Unexpected end of file";
            }
            pcVar29 = "%s: Cannot read number of sections: %s";
          }
        }
        else {
          iVar3 = feof(__stream);
          if (iVar3 == 0) {
            piVar20 = __errno_location();
            pcVar12 = strerror(*piVar20);
          }
          else {
            pcVar12 = "Unexpected end of file";
          }
          pcVar29 = "%s: Cannot read number of symbols: %s";
        }
      }
      else {
        iVar3 = feof(__stream);
        if (iVar3 == 0) {
          piVar20 = __errno_location();
          pcVar12 = strerror(*piVar20);
        }
        else {
          pcVar12 = "Unexpected end of file";
        }
        pcVar29 = "%s: Cannot read revision number: %s";
      }
LAB_001051dc:
      errx(pcVar29,fileName,pcVar12);
    }
    if (iVar3 == -1) {
      fatal((FileStackNode *)0x0,0,"File \"%s\" is empty!",fileName);
    }
    nodes[fileID].nbNodes = 1;
    pFVar11 = (FileStackNode *)malloc(0x20);
    pFVar2[fileID].nodes = pFVar11;
    if (pFVar11 != (FileStackNode *)0x0) {
      pFVar11->parent = (FileStackNode *)0x0;
      pFVar11->type = NODE_FILE;
      pcVar12 = strdup(fileName);
      (pFVar11->field_3).name = pcVar12;
      if (pcVar12 == (char *)0x0) {
        piVar20 = __errno_location();
        pcVar12 = strerror(*piVar20);
        fatal((FileStackNode *)0x0,0,"Failed to duplicate \"%s\"\'s name: %s",fileName,pcVar12);
      }
      sdobj_ReadFile(pFVar11,(FILE *)__stream);
      return;
    }
    pcVar12 = "Failed to get memory for %s\'s nodes";
  }
LAB_001050aa:
  err(pcVar12,fileName);
LAB_00104e6e:
  pcVar12 = pSVar16->name;
  iVar3 = feof(__stream);
  if (iVar3 == 0) {
    piVar20 = __errno_location();
    pcVar29 = strerror(*piVar20);
  }
  else {
    pcVar29 = "Unexpected end of file";
  }
  fmt = "%s: Cannot read \"%s\"\'s type: %s";
LAB_00105378:
  errx(fmt,fileName,pcVar12,pcVar29);
}

Assistant:

void obj_ReadFile(char const *fileName, unsigned int fileID)
{
	FILE *file;

	if (strcmp("-", fileName) != 0)
		file = fopen(fileName, "rb");
	else
		file = fdopen(STDIN_FILENO, "rb"); // `stdin` is in text mode by default

	if (!file)
		err("Could not open file %s", fileName);

	// First, check if the object is a RGBDS object or a SDCC one. If the first byte is 'R',
	// we'll assume it's a RGBDS object file, and otherwise, that it's a SDCC object file.
	int c = getc(file);

	ungetc(c, file); // Guaranteed to work
	switch (c) {
	case EOF:
		fatal(NULL, 0, "File \"%s\" is empty!", fileName);

	case 'R':
		break;

	default: // This is (probably) a SDCC object file, defer the rest of detection to it
		// Since SDCC does not provide line info, everything will be reported as coming from the
		// object file. It's better than nothing.
		nodes[fileID].nbNodes = 1;
		nodes[fileID].nodes =
			(struct FileStackNode *)malloc(sizeof(nodes[fileID].nodes[0]) * nodes[fileID].nbNodes);
		if (!nodes[fileID].nodes)
			err("Failed to get memory for %s's nodes", fileName);
		struct FileStackNode *where = &nodes[fileID].nodes[0];

		if (!where)
			fatal(NULL, 0, "Failed to alloc fstack node for \"%s\": %s", fileName, strerror(errno));
		where->parent = NULL;
		where->type = NODE_FILE;
		where->name = strdup(fileName);
		if (!where->name)
			fatal(NULL, 0, "Failed to duplicate \"%s\"'s name: %s", fileName, strerror(errno));

		sdobj_ReadFile(where, file);
		return;
	}

	// Begin by reading the magic bytes
	int matchedElems;

	if (fscanf(file, RGBDS_OBJECT_VERSION_STRING "%n", &matchedElems) == 1
	 && matchedElems != strlen(RGBDS_OBJECT_VERSION_STRING))
		errx("%s: Not a RGBDS object file", fileName);

	verbosePrint("Reading object file %s\n",
		     fileName);

	uint32_t revNum;

	tryReadlong(revNum, file, "%s: Cannot read revision number: %s",
		    fileName);
	if (revNum != RGBDS_OBJECT_REV)
		errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s"
			" (expected revision %d, got %d)", fileName, get_package_version_string(),
			fileName, revNum > RGBDS_OBJECT_REV ? " or updating rgblink" : "",
			RGBDS_OBJECT_REV, revNum);

	uint32_t nbSymbols;
	uint32_t nbSections;

	tryReadlong(nbSymbols, file, "%s: Cannot read number of symbols: %s",
		    fileName);
	tryReadlong(nbSections, file, "%s: Cannot read number of sections: %s",
		    fileName);

	nbSectionsToAssign += nbSections;

	tryReadlong(nodes[fileID].nbNodes, file, "%s: Cannot read number of nodes: %s", fileName);
	nodes[fileID].nodes =
		(struct FileStackNode *)calloc(nodes[fileID].nbNodes, sizeof(nodes[fileID].nodes[0]));
	if (!nodes[fileID].nodes)
		err("Failed to get memory for %s's nodes", fileName);
	verbosePrint("Reading %u nodes...\n", nodes[fileID].nbNodes);
	for (uint32_t i = nodes[fileID].nbNodes; i--; )
		readFileStackNode(file, nodes[fileID].nodes, i, fileName);

	// This file's symbols, kept to link sections to them
	struct Symbol **fileSymbols = (struct Symbol **)malloc(sizeof(*fileSymbols) * nbSymbols + 1);

	if (!fileSymbols)
		err("Failed to get memory for %s's symbols", fileName);

	struct SymbolList *symbolList = (struct SymbolList *)malloc(sizeof(*symbolList));

	if (!symbolList)
		err("Failed to register %s's symbol list", fileName);
	symbolList->symbolList = fileSymbols;
	symbolList->nbSymbols = nbSymbols;
	symbolList->next = symbolLists;
	symbolLists = symbolList;

	uint32_t *nbSymPerSect = (uint32_t *)calloc(nbSections ? nbSections : 1,
					sizeof(*nbSymPerSect));

	verbosePrint("Reading %" PRIu32 " symbols...\n", nbSymbols);
	for (uint32_t i = 0; i < nbSymbols; i++) {
		// Read symbol
		struct Symbol *symbol = (struct Symbol *)malloc(sizeof(*symbol));

		if (!symbol)
			err("%s: Couldn't create new symbol", fileName);
		readSymbol(file, symbol, fileName, nodes[fileID].nodes);

		fileSymbols[i] = symbol;
		if (symbol->type == SYMTYPE_EXPORT)
			sym_AddSymbol(symbol);
		if (symbol->sectionID != -1)
			nbSymPerSect[symbol->sectionID]++;
	}

	// This file's sections, stored in a table to link symbols to them
	struct Section **fileSections =
		(struct Section **)malloc(sizeof(*fileSections) * (nbSections ? nbSections : 1));

	verbosePrint("Reading %" PRIu32 " sections...\n", nbSections);
	for (uint32_t i = 0; i < nbSections; i++) {
		// Read section
		fileSections[i] = (struct Section *)malloc(sizeof(*fileSections[i]));
		if (!fileSections[i])
			err("%s: Couldn't create new section", fileName);

		fileSections[i]->nextu = NULL;
		readSection(file, fileSections[i], fileName, nodes[fileID].nodes);
		fileSections[i]->fileSymbols = fileSymbols;
		if (nbSymPerSect[i]) {
			fileSections[i]->symbols =
				(struct Symbol **)malloc(nbSymPerSect[i] * sizeof(*fileSections[i]->symbols));
			if (!fileSections[i]->symbols)
				err("%s: Couldn't link to symbols",
				    fileName);
		} else {
			fileSections[i]->symbols = NULL;
		}
		fileSections[i]->nbSymbols = 0;

		sect_AddSection(fileSections[i]);
	}

	free(nbSymPerSect);

	// Give patches' PC section pointers to their sections
	for (uint32_t i = 0; i < nbSections; i++) {
		if (sect_HasData(fileSections[i]->type)) {
			for (uint32_t j = 0; j < fileSections[i]->nbPatches; j++)
				linkPatchToPCSect(&fileSections[i]->patches[j], fileSections);
		}
	}

	// Give symbols' section pointers to their sections
	for (uint32_t i = 0; i < nbSymbols; i++) {
		int32_t sectionID = fileSymbols[i]->sectionID;

		if (sectionID == -1) {
			fileSymbols[i]->section = NULL;
		} else {
			struct Section *section = fileSections[sectionID];

			// Give the section a pointer to the symbol as well
			linkSymToSect(fileSymbols[i], section);

			if (section->modifier != SECTION_NORMAL) {
				if (section->modifier == SECTION_FRAGMENT)
					// Add the fragment's offset to the symbol's
					fileSymbols[i]->offset += section->offset;
				section = getMainSection(section);
			}
			fileSymbols[i]->section = section;
		}
	}

	uint32_t nbAsserts;

	tryReadlong(nbAsserts, file, "%s: Cannot read number of assertions: %s",
		    fileName);
	verbosePrint("Reading %" PRIu32 " assertions...\n", nbAsserts);
	for (uint32_t i = 0; i < nbAsserts; i++) {
		struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

		if (!assertion)
			err("%s: Couldn't create new assertion", fileName);
		readAssertion(file, assertion, fileName, i, nodes[fileID].nodes);
		linkPatchToPCSect(&assertion->patch, fileSections);
		assertion->fileSymbols = fileSymbols;
		assertion->next = assertions;
		assertions = assertion;
	}

	free(fileSections);
	fclose(file);
}